

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O3

Gia_Man_t *
Gia_GenQbfMiter(Gia_Man_t *p,int nFrames,int nLutNum,int nLutSize,char *pStr,int fUseOut,
               int fVerbose)

{
  char *pcVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  uint *__ptr;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  Vec_Int_t *vFlops;
  Vec_Int_t *p_00;
  int *piVar7;
  Gia_Man_t *p_01;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  Vec_Int_t *__ptr_00;
  Gia_Man_t *pGVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int Entry;
  int iVar18;
  long lVar19;
  
  bVar4 = (byte)nLutSize & 0x1f;
  iVar16 = nLutNum << bVar4;
  vFlops = Gia_GenCollectFlopIndexes(pStr,nLutNum,nLutSize,p->nRegs);
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar15 = 0x10;
  if (0xe < iVar16 - 1U) {
    iVar15 = iVar16;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar15;
  if (iVar15 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar15 << 2);
  }
  p_00->pArray = piVar7;
  if (0 < nLutNum << bVar4) {
    iVar15 = 0;
    iVar18 = 2;
    do {
      Entry = iVar18;
      if (iVar15 == 0) {
        Entry = 1;
      }
      Vec_IntPush(p_00,Entry);
      iVar15 = iVar15 + 1;
      iVar18 = iVar18 + 2;
    } while (iVar16 != iVar15);
  }
  p_01 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar1);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar1);
  }
  p_01->pName = pcVar9;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar1);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar1);
  }
  p_01->pSpec = pcVar9;
  Gia_ManHashAlloc(p_01);
  p->pObjs->Value = 0;
  if (0 < nLutNum << bVar4) {
    do {
      pGVar10 = Gia_ManAppendObj(p_01);
      uVar2 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar2 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar2 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar3 = p_01->pObjs;
      if ((pGVar10 < pGVar3) || (pGVar3 + p_01->nObjs <= pGVar10)) goto LAB_0079e25d;
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar3) >> 2) * -0x55555555);
      if ((pGVar10 < p_01->pObjs) || (p_01->pObjs + p_01->nObjs <= pGVar10)) goto LAB_0079e25d;
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
  }
  pVVar12 = p->vCis;
  if (0 < pVVar12->nSize) {
    lVar17 = 0;
    do {
      iVar15 = pVVar12->pArray[lVar17];
      if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_0079e27c;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_01);
      uVar2 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar2 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar2 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar10 = p_01->pObjs;
      if ((pGVar11 < pGVar10) || (pGVar10 + p_01->nObjs <= pGVar11)) {
LAB_0079e25d:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar10) >> 2) * -0x55555555);
      pGVar10 = p_01->pObjs;
      if ((pGVar11 < pGVar10) || (pGVar10 + p_01->nObjs <= pGVar11)) goto LAB_0079e25d;
      pGVar3[iVar15].Value = (int)((ulong)((long)pGVar11 - (long)pGVar10) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pVVar12 = p->vCis;
    } while (lVar17 < pVVar12->nSize);
  }
  iVar15 = p->nObjs;
  if (0 < iVar15) {
    lVar17 = 8;
    lVar19 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar2 = *(ulong *)((long)pGVar3 + lVar17 + -8);
      if ((uVar2 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar2) {
        uVar6 = *(uint *)((long)pGVar3 + lVar17 + (ulong)(uint)((int)(uVar2 & 0x1fffffff) << 2) * -3
                         );
        if (((int)uVar6 < 0) ||
           (uVar5 = *(uint *)((long)pGVar3 +
                             lVar17 + (ulong)((uint)(uVar2 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar5 < 0)) goto LAB_0079e29b;
        iVar15 = Gia_ManHashAnd(p_01,uVar6 ^ (uint)(uVar2 >> 0x1d) & 1,
                                uVar5 ^ (uint)(uVar2 >> 0x3d) & 1);
        *(int *)(&pGVar3->field_0x0 + lVar17) = iVar15;
        iVar15 = p->nObjs;
      }
      lVar19 = lVar19 + 1;
      lVar17 = lVar17 + 0xc;
    } while (lVar19 < iVar15);
  }
  lVar17 = (long)p->vCos->nSize;
  if (0 < lVar17) {
    piVar7 = p->vCos->pArray;
    lVar19 = 0;
    do {
      iVar16 = piVar7[lVar19];
      if (((long)iVar16 < 0) || (iVar15 <= iVar16)) goto LAB_0079e27c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar16;
      if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0)
      goto LAB_0079e29b;
      pGVar3->Value =
           (uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
           pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value;
      lVar19 = lVar19 + 1;
    } while (lVar17 != lVar19);
  }
  pVVar12 = Gia_GenCreateMuxes(p,p_01,vFlops,nLutNum,nLutSize,p_00,0);
  __ptr_00 = Gia_GenCreateMuxes(p,p_01,vFlops,nLutNum,nLutSize,p_00,1);
  if ((0 < pVVar12->nSize) && (0 < __ptr_00->nSize)) {
    piVar7 = pVVar12->pArray;
    iVar15 = *piVar7;
    __ptr = (uint *)__ptr_00->pArray;
    uVar6 = *__ptr;
    if (fUseOut != 0) {
      iVar16 = p->vCos->nSize;
      uVar5 = ~p->nRegs + iVar16;
      if (((int)uVar5 < 0) || (iVar16 <= (int)uVar5)) goto LAB_0079e2ba;
      iVar16 = p->vCos->pArray[uVar5];
      if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) {
LAB_0079e27c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar14 = (uint)*(undefined8 *)(p->pObjs + iVar16);
      uVar5 = (p->pObjs + iVar16)[-(ulong)(uVar14 & 0x1fffffff)].Value;
      if ((int)uVar5 < 0) {
LAB_0079e29b:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar6 = Gia_ManHashAnd(p_01,uVar6,uVar5 ^ uVar14 >> 0x1d & 1 ^ 1);
    }
    if ((-1 < (int)uVar6) && (uVar6 = Gia_ManHashAnd(p_01,iVar15,uVar6 ^ 1), -1 < (int)uVar6)) {
      iVar15 = Gia_ManHashAnd(p_01,uVar6 ^ 1,2);
      Gia_ManAppendCo(p_01,iVar15);
      free(piVar7);
      free(pVVar12);
      free(__ptr);
      free(__ptr_00);
      if (vFlops->pArray != (int *)0x0) {
        free(vFlops->pArray);
      }
      free(vFlops);
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
      }
      free(p_00);
      pGVar13 = Gia_ManCleanup(p_01);
      Gia_ManStop(p_01);
      return pGVar13;
    }
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x131,"int Abc_LitNot(int)");
  }
LAB_0079e2ba:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Gia_Man_t * Gia_GenQbfMiter( Gia_Man_t * p, int nFrames, int nLutNum, int nLutSize, char * pStr, int fUseOut, int fVerbose )
{
    Gia_Obj_t * pObj; 
    Gia_Man_t * pTemp, * pNew;
    int i, iMiter, iLut0, iLut1, nPars = nLutNum * (1 << nLutSize);
    Vec_Int_t * vLits0, * vLits1, * vParLits;
    Vec_Int_t * vFlops = Gia_GenCollectFlopIndexes( pStr, nLutNum, nLutSize, Gia_ManRegNum(p) );
    // collect parameter literals (data vars)
    vParLits = Vec_IntAlloc( nPars );
    for ( i = 0; i < nPars; i++ )
        Vec_IntPush( vParLits, i ? Abc_Var2Lit(i+1, 0) : 1 );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < nPars; i++ )
        Gia_ManAppendCi( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    vLits0 = Gia_GenCreateMuxes( p, pNew, vFlops, nLutNum, nLutSize, vParLits, 0 );
    vLits1 = Gia_GenCreateMuxes( p, pNew, vFlops, nLutNum, nLutSize, vParLits, 1 );
    // create miter output
    //iMiter = Gia_ManHashAnd( pNew, Vec_IntEntry(vLits0, 0), Abc_LitNot(Vec_IntEntry(vLits1, 0)) );
    ///////////////////////////////////////////////////////////////////////////
    iLut0 = Vec_IntEntry(vLits0, 0);
    iLut1 = Vec_IntEntry(vLits1, 0);
    if ( fUseOut )
    {
        Gia_Obj_t * pObjPoLast = Gia_ManPo( p, Gia_ManPoNum(p)-1 );
        int iOut = Abc_LitNotCond( Gia_ObjFanin0Copy(pObjPoLast), 0 );
        iLut1 = Gia_ManHashAnd( pNew, iLut1, Abc_LitNot(iOut) );
    }
    iMiter = Gia_ManHashAnd( pNew, iLut0, Abc_LitNot(iLut1) );
    ///////////////////////////////////////////////////////////////////////////
    iMiter = Gia_ManHashAnd( pNew, Abc_LitNot(iMiter), Abc_Var2Lit(1, 0) );
    Gia_ManAppendCo( pNew, iMiter );
    // cleanup
    Vec_IntFree( vLits0 );
    Vec_IntFree( vLits1 );
    Vec_IntFree( vFlops );
    Vec_IntFree( vParLits );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}